

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_u8x4.c
# Opt level: O0

image_u8x4_t * image_u8x4_create_from_pam(char *inpath)

{
  pam_t *pam_00;
  int local_34;
  int local_30;
  int x_1;
  int x;
  int y;
  image_u8x4_t *im;
  pam_t *pam;
  char *inpath_local;
  
  pam_00 = pam_create_from_file(inpath);
  if (pam_00 == (pam_t *)0x0) {
    inpath_local = (char *)0x0;
  }
  else {
    inpath_local = (char *)image_u8x4_create(pam_00->width,pam_00->height);
    for (x_1 = 0; x_1 < pam_00->height; x_1 = x_1 + 1) {
      if (pam_00->depth == 1) {
        for (local_30 = 0; local_30 < pam_00->width; local_30 = local_30 + 1) {
          ((image_u8x4_t *)inpath_local)->buf
          [x_1 * ((image_u8x4_t *)inpath_local)->stride + local_30 * 4] =
               pam_00->data[pam_00->width * x_1 + local_30];
          ((image_u8x4_t *)inpath_local)->buf
          [x_1 * ((image_u8x4_t *)inpath_local)->stride + local_30 * 4 + 1] =
               pam_00->data[pam_00->width * x_1 + local_30];
          ((image_u8x4_t *)inpath_local)->buf
          [x_1 * ((image_u8x4_t *)inpath_local)->stride + local_30 * 4 + 2] =
               pam_00->data[pam_00->width * x_1 + local_30];
          ((image_u8x4_t *)inpath_local)->buf
          [x_1 * ((image_u8x4_t *)inpath_local)->stride + local_30 * 4 + 3] = 0xff;
        }
      }
      else if (pam_00->depth == 3) {
        for (local_34 = 0; local_34 < pam_00->width; local_34 = local_34 + 1) {
          ((image_u8x4_t *)inpath_local)->buf
          [x_1 * ((image_u8x4_t *)inpath_local)->stride + local_34 * 4] =
               pam_00->data[pam_00->width * 3 * x_1 + local_34 * 3];
          ((image_u8x4_t *)inpath_local)->buf
          [x_1 * ((image_u8x4_t *)inpath_local)->stride + local_34 * 4 + 1] =
               pam_00->data[pam_00->width * 3 * x_1 + local_34 * 3 + 1];
          ((image_u8x4_t *)inpath_local)->buf
          [x_1 * ((image_u8x4_t *)inpath_local)->stride + local_34 * 4 + 2] =
               pam_00->data[pam_00->width * 3 * x_1 + local_34 * 3 + 2];
          ((image_u8x4_t *)inpath_local)->buf
          [x_1 * ((image_u8x4_t *)inpath_local)->stride + local_34 * 4 + 3] = 0xff;
        }
      }
      else {
        if (pam_00->depth != 4) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/image_u8x4.c"
                        ,0x70,"image_u8x4_t *image_u8x4_create_from_pam(const char *)");
        }
        memcpy(((image_u8x4_t *)inpath_local)->buf + x_1 * ((image_u8x4_t *)inpath_local)->stride,
               pam_00->data + pam_00->width * 4 * x_1,(long)(pam_00->width << 2));
      }
    }
    pam_destroy(pam_00);
  }
  return (image_u8x4_t *)inpath_local;
}

Assistant:

image_u8x4_t *image_u8x4_create_from_pam(const char *inpath)
{
    pam_t *pam = pam_create_from_file(inpath);
    if (!pam)
        return NULL;

    image_u8x4_t *im = image_u8x4_create(pam->width, pam->height);

    for (int y = 0; y < pam->height; y++) {
        if (pam->depth == 1) {
            for (int x = 0; x < pam->width; x++) {
                im->buf[y*im->stride + 4*x + 0] = pam->data[pam->width*y + x + 0];
                im->buf[y*im->stride + 4*x + 1] = pam->data[pam->width*y + x + 0];
                im->buf[y*im->stride + 4*x + 2] = pam->data[pam->width*y + x + 0];
                im->buf[y*im->stride + 4*x + 3] = 255;
            }
        } else if (pam->depth == 3) {
            for (int x = 0; x < pam->width; x++) {
                im->buf[y*im->stride + 4*x + 0] = pam->data[3*pam->width*y + 3*x + 0];
                im->buf[y*im->stride + 4*x + 1] = pam->data[3*pam->width*y + 3*x + 1];
                im->buf[y*im->stride + 4*x + 2] = pam->data[3*pam->width*y + 3*x + 2];
                im->buf[y*im->stride + 4*x + 3] = 255;
            }
        } else if (pam->depth == 4) {
            memcpy(&im->buf[y*im->stride], &pam->data[4*pam->width*y], 4*pam->width);
        } else {
            assert(0); // not implemented
        }
    }

    pam_destroy(pam);
    return im;
}